

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.h
# Opt level: O0

Counter * __thiscall
prometheus::Family<prometheus::Counter>::Add<>(Family<prometheus::Counter> *this,Labels *labels)

{
  Counter *pCVar1;
  unique_ptr<prometheus::Counter,_std::default_delete<prometheus::Counter>_> local_20;
  Labels *local_18;
  Labels *labels_local;
  Family<prometheus::Counter> *this_local;
  
  local_18 = labels;
  labels_local = (Labels *)this;
  detail::make_unique<prometheus::Counter>();
  pCVar1 = Add(this,labels,&local_20);
  std::unique_ptr<prometheus::Counter,_std::default_delete<prometheus::Counter>_>::~unique_ptr
            (&local_20);
  return pCVar1;
}

Assistant:

T& Add(const Labels& labels, Args&&... args) {
    return Add(labels, detail::make_unique<T>(args...));
  }